

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O1

ssl_open_record_t bssl::ssl_process_alert(SSL *ssl,uint8_t *out_alert,Span<const_unsigned_char> in)

{
  uchar uVar1;
  bool bVar2;
  uint16_t uVar3;
  byte bVar4;
  int reason;
  int line;
  size_t in_R9;
  Span<const_unsigned_char> in_00;
  
  if (in.size_ == 2) {
    in_00.size_ = in_R9;
    in_00.data_ = (uchar *)0x2;
    ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x15,(int)in.data_,in_00);
    uVar1 = *in.data_;
    bVar4 = in.data_[1];
    ssl_do_info_callback(ssl,0x4004,(uint)CONCAT11(uVar1,bVar4));
    if (uVar1 == '\x02') {
      ERR_put_error(0x10,0,bVar4 + 1000,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x1e6);
      ERR_add_error_dataf("SSL alert number %d",(ulong)bVar4);
      *out_alert = '\0';
      return ssl_open_record_error;
    }
    if (uVar1 == '\x01') {
      if (bVar4 == 0) {
        ssl->s3->read_shutdown = ssl_shutdown_close_notify;
        return ssl_open_record_close_notify;
      }
      bVar2 = ssl_has_final_version(ssl);
      if (((bVar2) && (uVar3 = ssl_protocol_version(ssl), bVar4 != 0x5a)) && (0x303 < uVar3)) {
        *out_alert = '2';
        reason = 0x66;
        line = 0x1d8;
      }
      else {
        bVar4 = ssl->s3->warning_alert_count + 1;
        ssl->s3->warning_alert_count = bVar4;
        if (bVar4 < 5) {
          return ssl_open_record_discard;
        }
        *out_alert = '\n';
        reason = 0xdc;
        line = 0x1df;
      }
    }
    else {
      *out_alert = '/';
      reason = 0xe3;
      line = 0x1ed;
    }
  }
  else {
    *out_alert = '2';
    reason = 0x66;
    line = 0x1bd;
  }
  ERR_put_error(0x10,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                ,line);
  return ssl_open_record_error;
}

Assistant:

enum ssl_open_record_t ssl_process_alert(SSL *ssl, uint8_t *out_alert,
                                         Span<const uint8_t> in) {
  // Alerts records may not contain fragmented or multiple alerts.
  if (in.size() != 2) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ALERT);
    return ssl_open_record_error;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_ALERT, in);

  const uint8_t alert_level = in[0];
  const uint8_t alert_descr = in[1];

  uint16_t alert = (alert_level << 8) | alert_descr;
  ssl_do_info_callback(ssl, SSL_CB_READ_ALERT, alert);

  if (alert_level == SSL3_AL_WARNING) {
    if (alert_descr == SSL_AD_CLOSE_NOTIFY) {
      ssl->s3->read_shutdown = ssl_shutdown_close_notify;
      return ssl_open_record_close_notify;
    }

    // Warning alerts do not exist in TLS 1.3, but RFC 8446 section 6.1
    // continues to define user_canceled as a signal to cancel the handshake,
    // without specifying how to handle it. JDK11 misuses it to signal
    // full-duplex connection close after the handshake. As a workaround, skip
    // user_canceled as in TLS 1.2. This matches NSS and OpenSSL.
    if (ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
        alert_descr != SSL_AD_USER_CANCELLED) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ALERT);
      return ssl_open_record_error;
    }

    ssl->s3->warning_alert_count++;
    if (ssl->s3->warning_alert_count > kMaxWarningAlerts) {
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_WARNING_ALERTS);
      return ssl_open_record_error;
    }
    return ssl_open_record_discard;
  }

  if (alert_level == SSL3_AL_FATAL) {
    OPENSSL_PUT_ERROR(SSL, SSL_AD_REASON_OFFSET + alert_descr);
    ERR_add_error_dataf("SSL alert number %d", alert_descr);
    *out_alert = 0;  // No alert to send back to the peer.
    return ssl_open_record_error;
  }

  *out_alert = SSL_AD_ILLEGAL_PARAMETER;
  OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_ALERT_TYPE);
  return ssl_open_record_error;
}